

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::Value::insert(Value *this,size_t index,Value *v)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *this_01;
  long in_RDI;
  value_type *in_stack_00000028;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_00000030;
  const_iterator in_stack_00000038;
  bool in_stack_00000103;
  int in_stack_00000104;
  Value *in_stack_00000108;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
  *in_stack_ffffffffffffff68;
  string local_38 [56];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    dump_abi_cxx11_(in_stack_00000108,in_stack_00000104,in_stack_00000103);
    std::operator+((char *)this_00,in_stack_ffffffffffffff60);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = std::
            __shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x305269);
  std::
  __shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x30527c);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::begin(in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>::
  operator+(in_stack_ffffffffffffff68,(difference_type)this_01);
  __gnu_cxx::
  __normal_iterator<minja::Value_const*,std::vector<minja::Value,std::allocator<minja::Value>>>::
  __normal_iterator<minja::Value*>
            ((__normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
              *)this_01,
             (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
              *)in_stack_ffffffffffffff58);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::insert
            (in_stack_00000030,in_stack_00000038,in_stack_00000028);
  return;
}

Assistant:

void insert(size_t index, const Value& v) {
    if (!array_)
      throw std::runtime_error("Value is not an array: " + dump());
    array_->insert(array_->begin() + index, v);
  }